

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O0

void __thiscall randomRoundTrip_basic_Test::TestBody(randomRoundTrip_basic_Test *this)

{
  bool bVar1;
  uint __b;
  result_type_conflict __s;
  unit *units;
  uint64_t match_flags;
  Message *pMVar2;
  char *message;
  unit *in_RCX;
  precise_unit pVar3;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  string local_a0;
  precise_unit local_80;
  unit local_70;
  unit resunit;
  string str;
  unit startunit;
  unit_data unitdata;
  result_type start;
  int ii;
  uniform_int_distribution<unsigned_int> distribution;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_18;
  default_random_engine engine;
  randomRoundTrip_basic_Test *this_local;
  
  engine._M_x = (unsigned_long)this;
  distribution._M_param = (param_type)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&distribution);
  __s = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_18,__s);
  __b = std::numeric_limits<unsigned_int>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&start,0,__b);
  for (unitdata = (unit_data)0x0; (int)unitdata < 6000; unitdata = (unit_data)((int)unitdata + 1)) {
    startunit.base_units_ =
         (unit_data)
         std::uniform_int_distribution<unsigned_int>::operator()
                   ((uniform_int_distribution<unsigned_int> *)&start,&local_18);
    ::units::detail::unit_data::unit_data((unit_data *)&startunit,(nullptr_t)0x0);
    startunit.multiplier_ = (float)startunit.base_units_;
    ::units::unit::unit((unit *)(str.field_2._M_local_buf + 0xc),(unit_data *)&startunit);
    units = (unit *)::units::getDefaultFlags();
    ::units::to_string_abi_cxx11_
              ((string *)&resunit,(units *)(str.field_2._M_local_buf + 0xc),units,(uint64_t)in_RCX);
    std::__cxx11::string::string((string *)&local_a0,(string *)&resunit);
    match_flags = ::units::getDefaultFlags();
    pVar3 = ::units::unit_from_string(&local_a0,match_flags);
    local_80 = pVar3;
    local_70 = ::units::unit_cast(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    in_RCX = (unit *)((long)&str.field_2 + 0xc);
    testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
              ((EqHelper *)local_c0,"startunit","resunit",in_RCX,&local_70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pMVar2 = testing::Message::operator<<(&local_c8,(char (*) [19])"round trip failed ");
      pMVar2 = testing::Message::operator<<(pMVar2,(uint *)&startunit.base_units_);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      in_RCX = (unit *)0x23;
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_random_round_trip.cpp"
                 ,0x23,message);
      testing::internal::AssertHelper::operator=(&local_d0,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    std::__cxx11::string::~string((string *)&resunit);
  }
  return;
}

Assistant:

TEST(randomRoundTrip, basic)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        std::default_random_engine engine(
            std::chrono::system_clock::now().time_since_epoch().count());
        std::uniform_int_distribution<unsigned int> distribution(
            0, std::numeric_limits<unsigned int>::max());

        for (auto ii = 0; ii < 6000; ++ii) {
            auto start = distribution(engine);
            detail::unit_data unitdata(nullptr);
            memcpy(static_cast<void*>(&unitdata), &start, 4);
            auto startunit = unit(unitdata);
            auto str = to_string(startunit);
            auto resunit = unit_cast(unit_from_string(str));
            EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
        }
    }
}